

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9CachePolicyULT.cpp
# Opt level: O3

void CTestGen9CachePolicy::SetUpTestCase(void)

{
  undefined1 *puVar1;
  ADAPTER_INFO *pAVar2;
  
  CommonULT::GfxPlatform.eProductFamily = IGFX_SKYLAKE;
  CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_GEN9_CORE;
  CommonULT::AllocateAdapterInfo();
  pAVar2 = CommonULT::pGfxAdapterInfo;
  (CommonULT::pGfxAdapterInfo->SystemInfo).L3CacheSizeInKb = 0x300;
  (pAVar2->SystemInfo).LLCCacheSizeInKb = 0x800;
  (pAVar2->SystemInfo).EdramSizeInKb = 0x20000;
  puVar1 = &(pAVar2->SkuTable).field_1.field_0x1;
  *puVar1 = *puVar1 | 2;
  CommonULT::SetUpTestCase();
  puts("SetUpTestCase");
  return;
}

Assistant:

void CTestGen9CachePolicy::SetUpTestCase()
{
    GfxPlatform.eProductFamily    = IGFX_SKYLAKE;
    GfxPlatform.eRenderCoreFamily = IGFX_GEN9_CORE;

    AllocateAdapterInfo();

    pGfxAdapterInfo->SystemInfo.L3CacheSizeInKb                         = 768;
    pGfxAdapterInfo->SystemInfo.LLCCacheSizeInKb                        = 2 * 1024;   //2 MB
    pGfxAdapterInfo->SystemInfo.EdramSizeInKb                           = 128 * 1024; //128 MB
    const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrEDram = 1;

    CommonULT::SetUpTestCase();

    printf("%s\n", __FUNCTION__);
}